

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnF64ConstExpr(BinaryReaderIR *this,uint64_t value_bits)

{
  Result RVar1;
  Const local_90;
  Location local_58;
  _Head_base<0UL,_wabt::Expr_*,_false> local_38;
  Expr *local_30;
  
  GetLocation(&local_58,this);
  Const::Const(&local_90,value_bits,&local_58);
  MakeUnique<wabt::ConstExpr,wabt::Const>((wabt *)&local_30,&local_90);
  local_38._M_head_impl = local_30;
  local_30 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_38);
  if (local_38._M_head_impl != (Expr *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Expr[1])();
  }
  if (local_30 != (Expr *)0x0) {
    (**(code **)(*(long *)local_30 + 8))();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnF64ConstExpr(uint64_t value_bits) {
  return AppendExpr(
      MakeUnique<ConstExpr>(Const::F64(value_bits, GetLocation())));
}